

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O2

int rtosc_arg_val_add(rtosc_arg_val_t *lhs,rtosc_arg_val_t *rhs,rtosc_arg_val_t *res)

{
  char cVar1;
  char cVar2;
  int iVar3;
  
  cVar1 = lhs->type;
  cVar2 = rhs->type;
  if (cVar1 == cVar2) {
    res->type = cVar1;
    cVar1 = lhs->type;
    iVar3 = 0;
    switch(cVar1) {
    case 'c':
    case 'i':
      (res->val).i = (rhs->val).i + (lhs->val).i;
      break;
    case 'd':
      (res->val).d = (lhs->val).d + (rhs->val).d;
      break;
    case 'e':
    case 'g':
      goto switchD_0010e361_caseD_65;
    case 'f':
      (res->val).f = (lhs->val).f + (rhs->val).f;
      break;
    case 'h':
      (res->val).s = (rhs->val).s + (long)(lhs->val).s;
      break;
    default:
      if ((cVar1 != 'F') && (cVar1 != 'T')) {
        return 0;
      }
      res->type = 'F';
      (res->val).T = '\0';
    }
  }
  else {
    if ((cVar2 != 'T' || cVar1 != 'F') && (cVar2 != 'F' || cVar1 != 'T')) {
      return 0;
    }
    res->type = 'T';
    (res->val).T = '\x01';
  }
  iVar3 = 1;
switchD_0010e361_caseD_65:
  return iVar3;
}

Assistant:

int rtosc_arg_val_add(const rtosc_arg_val_t* lhs, const rtosc_arg_val_t* rhs,
                      rtosc_arg_val_t* res)
{
    if(lhs->type != rhs->type)
    {
        if((lhs->type == 'F' && rhs->type == 'T') ||
           (lhs->type == 'T' && rhs->type == 'F'))
        {
            res->type = 'T';
            res->val.T = 1;
            return true;
        }
        else return false;
    }
    else
    {
        res->type = lhs->type;
        switch(lhs->type)
        {
            case 'd': res->val.d = lhs->val.d + rhs->val.d; return true;
            case 'f': res->val.f = lhs->val.f + rhs->val.f; return true;
            case 'h': res->val.h = lhs->val.h + rhs->val.h; return true;
            case 'c':
            case 'i': res->val.i = lhs->val.i + rhs->val.i; return true;
            case 'T':
            case 'F': res->type = 'F'; res->val.T = 0; return true;
            default: return false;
        }
    }
}